

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::~ExtensionSet(ExtensionSet *this)

{
  KeyValue *pKVar1;
  long lVar2;
  
  if (this->arena_ == (Arena *)0x0) {
    pKVar1 = (this->map_).flat;
    if (this->flat_capacity_ < 0x101) {
      if (this->flat_size_ != 0) {
        lVar2 = (ulong)this->flat_size_ << 5;
        do {
          Extension::Free(&pKVar1->second);
          pKVar1 = (KeyValue *)(&pKVar1->second + 1);
          lVar2 = lVar2 + -0x20;
        } while (lVar2 != 0);
      }
    }
    else {
      ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::~_Rb_tree_iterator()::__0>
                ((pKVar1->second).descriptor,&pKVar1->second);
    }
    pKVar1 = (this->map_).flat;
    if (this->flat_capacity_ < 0x101) {
      if (pKVar1 != (KeyValue *)0x0) {
        operator_delete__(pKVar1);
        return;
      }
    }
    else if (pKVar1 != (KeyValue *)0x0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                   *)pKVar1);
      operator_delete(pKVar1);
      return;
    }
  }
  return;
}

Assistant:

ExtensionSet::~ExtensionSet() {
  // Deletes all allocated extensions.
  if (arena_ == NULL) {
    ForEach([](int /* number */, Extension& ext) { ext.Free(); });
    if (PROTOBUF_PREDICT_FALSE(is_large())) {
      delete map_.large;
    } else {
      DeleteFlatMap(map_.flat, flat_capacity_);
    }
  }
}